

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void Curl_debug(Curl_easy *data,curl_infotype type,char *ptr,size_t size)

{
  _Bool value;
  int iVar1;
  size_t sVar2;
  _Bool inCallback;
  size_t len;
  char buf [2048];
  size_t size_local;
  char *ptr_local;
  curl_infotype type_local;
  Curl_easy *data_local;
  
  if ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0) {
    buf._2040_8_ = size;
    if ((data->set).fdebug == (curl_debug_callback)0x0) {
      if (type < CURLINFO_DATA_IN) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_ids.log_level)) {
          sVar2 = trc_print_ids(data,(char *)&len,0x800);
          fwrite(&len,sVar2,1,(FILE *)(data->set).err);
        }
        fwrite(Curl_debug::s_infotype + type,2,1,(FILE *)(data->set).err);
        fwrite(ptr,buf._2040_8_,1,(FILE *)(data->set).err);
      }
    }
    else {
      value = Curl_is_in_callback(data);
      if (((data == (Curl_easy *)0x0) || ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) == 0)) ||
         ((((data->state).feat != (curl_trc_feat *)0x0 && (((data->state).feat)->log_level < 1)) ||
          ((Curl_trc_feat_ids.log_level < 1 || (0x7ff < (ulong)buf._2040_8_)))))) {
        Curl_set_in_callback(data,true);
        (*(data->set).fdebug)(data,type,ptr,buf._2040_8_,(data->set).debugdata);
        Curl_set_in_callback(data,value);
      }
      else {
        sVar2 = trc_print_ids(data,(char *)&len,0x800);
        iVar1 = curl_msnprintf(buf + (sVar2 - 8),0x800 - sVar2,"%.*s",buf._2040_8_ & 0xffffffff,ptr)
        ;
        sVar2 = trc_end_buf((char *)&len,(long)iVar1 + sVar2,0x800,false);
        Curl_set_in_callback(data,true);
        (*(data->set).fdebug)(data,type,(char *)&len,sVar2,(data->set).debugdata);
        Curl_set_in_callback(data,value);
      }
    }
  }
  return;
}

Assistant:

void Curl_debug(struct Curl_easy *data, curl_infotype type,
                const char *ptr, size_t size)
{
  if(data->set.verbose) {
    static const char s_infotype[CURLINFO_END][3] = {
      "* ", "< ", "> ", "{ ", "} ", "{ ", "} " };
    char buf[TRC_LINE_MAX];
    size_t len;
    if(data->set.fdebug) {
      bool inCallback = Curl_is_in_callback(data);

      if(CURL_TRC_IDS(data) && (size < TRC_LINE_MAX)) {
        len = trc_print_ids(data, buf, TRC_LINE_MAX);
        len += msnprintf(buf + len, TRC_LINE_MAX - len, "%.*s",
                         (int)size, ptr);
        len = trc_end_buf(buf, len, TRC_LINE_MAX, FALSE);
        Curl_set_in_callback(data, TRUE);
        (void)(*data->set.fdebug)(data, type, buf, len, data->set.debugdata);
        Curl_set_in_callback(data, inCallback);
      }
      else {
        Curl_set_in_callback(data, TRUE);
        (void)(*data->set.fdebug)(data, type, CURL_UNCONST(ptr),
                                  size, data->set.debugdata);
        Curl_set_in_callback(data, inCallback);
      }
    }
    else {
      switch(type) {
      case CURLINFO_TEXT:
      case CURLINFO_HEADER_OUT:
      case CURLINFO_HEADER_IN:
        if(CURL_TRC_IDS(data)) {
          len = trc_print_ids(data, buf, TRC_LINE_MAX);
          fwrite(buf, len, 1, data->set.err);
        }
        fwrite(s_infotype[type], 2, 1, data->set.err);
        fwrite(ptr, size, 1, data->set.err);
        break;
      default: /* nada */
        break;
      }
    }
  }
}